

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blend_a64_mask_test.cc
# Opt level: O2

void __thiscall
(anonymous_namespace)::BlendA64MaskTestHBD_RandomValues_Test::~BlendA64MaskTestHBD_RandomValues_Test
          (BlendA64MaskTestHBD_RandomValues_Test *this)

{
  anon_unknown.dwarf_17b8f50::BlendA64MaskTestHBD_RandomValues_Test::
  ~BlendA64MaskTestHBD_RandomValues_Test((BlendA64MaskTestHBD_RandomValues_Test *)(this + -0x10));
  return;
}

Assistant:

TEST_P(BlendA64MaskTestHBD, RandomValues) {
  for (bit_depth_ = 8; bit_depth_ <= 12 && !HasFatalFailure();
       bit_depth_ += 2) {
    const int hi = 1 << bit_depth_;

    for (int bsize = 0; bsize < BLOCK_SIZES_ALL; ++bsize) {
      for (int i = 0; i < kBufSize; ++i) {
        dst_ref_[i] = rng_(hi);
        dst_tst_[i] = rng_(hi);
        src0_[i] = rng_(hi);
        src1_[i] = rng_(hi);
      }

      for (int i = 0; i < kMaxMaskSize; ++i)
        mask_[i] = rng_(AOM_BLEND_A64_MAX_ALPHA + 1);

      RunTest(bsize, 1);
    }
  }
}